

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotHeatmap<unsigned_short>
               (char *label_id,unsigned_short *values,int rows,int cols,double scale_min,
               double scale_max,char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TransformerLinLin transformer;
  ImPlotPlot *pIVar6;
  double dVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  bool bVar10;
  ImDrawList *DrawList;
  ImPlotRange *pIVar11;
  ulong uVar12;
  ulong uVar13;
  
  bVar10 = BeginItem(label_id,-1);
  pIVar9 = GImPlot;
  if (!bVar10) {
    return;
  }
  if (GImPlot->FitThisFrame != true) goto LAB_0022ecc9;
  dVar1 = bounds_min->x;
  dVar2 = bounds_min->y;
  pIVar6 = GImPlot->CurrentPlot;
  iVar3 = pIVar6->CurrentYAxis;
  uVar4 = (pIVar6->XAxis).Flags;
  if ((uVar4 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
LAB_0022eaf8:
      if ((0.0 < dVar1) || ((uVar4 & 0x20) == 0)) {
        dVar7 = (GImPlot->ExtentsX).Min;
        dVar8 = (GImPlot->ExtentsX).Max;
        uVar12 = -(ulong)(dVar1 < dVar7);
        uVar13 = -(ulong)(dVar8 < dVar1);
        (GImPlot->ExtentsX).Min = (double)(~uVar12 & (ulong)dVar7 | (ulong)dVar1 & uVar12);
        (pIVar9->ExtentsX).Max = (double)(~uVar13 & (ulong)dVar8 | (ulong)dVar1 & uVar13);
      }
    }
  }
  else if ((((ulong)ABS(dVar1) < 0x7ff0000000000000) && (pIVar6->YAxis[iVar3].Range.Min <= dVar2))
          && (dVar2 <= pIVar6->YAxis[iVar3].Range.Max)) goto LAB_0022eaf8;
  pIVar11 = pIVar9->ExtentsY + iVar3;
  uVar5 = pIVar6->YAxis[iVar3].Flags;
  if ((uVar5 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
LAB_0022eb84:
      if ((0.0 < dVar2) || ((uVar5 & 0x20) == 0)) {
        dVar1 = pIVar9->ExtentsY[iVar3].Max;
        uVar12 = -(ulong)(dVar2 < pIVar11->Min);
        uVar13 = -(ulong)(dVar1 < dVar2);
        pIVar11->Min = (double)(~uVar12 & (ulong)pIVar11->Min | (ulong)dVar2 & uVar12);
        pIVar9->ExtentsY[iVar3].Max = (double)(~uVar13 & (ulong)dVar1 | (ulong)dVar2 & uVar13);
      }
    }
  }
  else if ((((ulong)ABS(dVar2) < 0x7ff0000000000000) && ((pIVar6->XAxis).Range.Min <= dVar1)) &&
          (dVar1 <= (pIVar6->XAxis).Range.Max)) goto LAB_0022eb84;
  dVar1 = bounds_max->x;
  dVar2 = bounds_max->y;
  if ((uVar4 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
LAB_0022ec0a:
      if (((uVar4 & 0x20) == 0) || (0.0 < dVar1)) {
        dVar7 = (pIVar9->ExtentsX).Min;
        dVar8 = (pIVar9->ExtentsX).Max;
        uVar12 = -(ulong)(dVar1 < dVar7);
        uVar13 = -(ulong)(dVar8 < dVar1);
        (pIVar9->ExtentsX).Min = (double)(~uVar12 & (ulong)dVar7 | (ulong)dVar1 & uVar12);
        (pIVar9->ExtentsX).Max = (double)(~uVar13 & (ulong)dVar8 | (ulong)dVar1 & uVar13);
      }
    }
  }
  else if ((((ulong)ABS(dVar1) < 0x7ff0000000000000) && (pIVar6->YAxis[iVar3].Range.Min <= dVar2))
          && (dVar2 <= pIVar6->YAxis[iVar3].Range.Max)) goto LAB_0022ec0a;
  if ((uVar5 >> 10 & 1) == 0) {
    if (0x7fefffffffffffff < (ulong)ABS(dVar2)) goto LAB_0022ecc9;
  }
  else if (((0x7fefffffffffffff < (ulong)ABS(dVar2)) || (dVar1 < (pIVar6->XAxis).Range.Min)) ||
          ((pIVar6->XAxis).Range.Max < dVar1)) goto LAB_0022ecc9;
  if (((uVar5 & 0x20) == 0) || (0.0 < dVar2)) {
    dVar1 = pIVar9->ExtentsY[iVar3].Max;
    uVar12 = -(ulong)(dVar2 < pIVar11->Min);
    uVar13 = -(ulong)(dVar1 < dVar2);
    pIVar11->Min = (double)(~uVar12 & (ulong)pIVar11->Min | (ulong)dVar2 & uVar12);
    pIVar9->ExtentsY[iVar3].Max = (double)(~uVar13 & (ulong)dVar1 | (ulong)dVar2 & uVar13);
  }
LAB_0022ecc9:
  DrawList = GetPlotDrawList();
  transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
  switch(GImPlot->Scales[transformer.YAxis]) {
  case 0:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLinLin>
              (transformer,DrawList,values,rows,cols,scale_min,scale_max,fmt,bounds_min,bounds_max,
               true);
    break;
  case 1:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLogLin>
              ((TransformerLogLin)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 2:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLinLog>
              ((TransformerLinLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 3:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLogLog>
              ((TransformerLogLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
  }
  pIVar9 = GImPlot;
  PopPlotClipRect();
  ImPlotNextItemData::Reset(&pIVar9->NextItemData);
  pIVar9->PreviousItem = pIVar9->CurrentItem;
  pIVar9->CurrentItem = (ImPlotItem *)0x0;
  return;
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
        }
        EndItem();
    }
}